

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void HistogramStatsClear(VP8LHistogram *h)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 5; local_c = local_c + 1) {
    *(undefined2 *)(in_RDI + 0xcac + (long)local_c * 2) = 0xffff;
    *(undefined1 *)(in_RDI + 0xce8 + (long)local_c) = 1;
  }
  *(undefined8 *)(in_RDI + 0xcb8) = 0;
  memset((void *)(in_RDI + 0xcc0),0,0x28);
  return;
}

Assistant:

static void HistogramStatsClear(VP8LHistogram* const h) {
  int i;
  for (i = 0; i < 5; ++i) {
    h->trivial_symbol[i] = VP8L_NON_TRIVIAL_SYM;
    // By default, the histogram is assumed to be used.
    h->is_used[i] = 1;
  }
  h->bit_cost = 0;
  memset(h->costs, 0, sizeof(h->costs));
}